

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MapFieldGenerator::MapFieldGenerator
          (MapFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  ObjectiveCType OVar1;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  FieldGenerator *pFVar4;
  mapped_type *pmVar5;
  long lVar6;
  char *pcVar7;
  FieldDescriptor *field;
  bool local_641;
  allocator<char> local_509;
  key_type local_508;
  string local_4e8;
  allocator<char> local_4c1;
  key_type local_4c0;
  string local_4a0;
  allocator<char> local_479;
  key_type local_478;
  string local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  allocator<char> local_3d1;
  key_type local_3d0;
  allocator<char> local_3a9;
  undefined1 local_3a8 [8];
  string class_name;
  key_type local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  allocator<char> local_2f9;
  key_type local_2f8;
  bool local_2d1;
  ObjectiveCType local_2d0;
  bool value_is_object_type;
  ObjectiveCType value_objc_type;
  string local_2a8;
  allocator<char> local_281;
  value_type local_280;
  allocator<char> local_259;
  value_type local_258;
  string local_238;
  string *local_218;
  string *value_field_flags;
  value_type local_208;
  allocator<char> local_1e1;
  key_type local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  field_flags;
  key_type local_160;
  string local_140;
  allocator<char> local_119;
  key_type local_118;
  string local_f8;
  allocator<char> local_d1;
  key_type local_d0;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  FieldDescriptor *local_68;
  FieldDescriptor *value_descriptor;
  string local_58;
  FieldDescriptor *local_38;
  FieldDescriptor *key_descriptor;
  Options *local_20;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  MapFieldGenerator *this_local;
  
  local_20 = options;
  options_local = (Options *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  RepeatedFieldGenerator::RepeatedFieldGenerator
            (&this->super_RepeatedFieldGenerator,descriptor,options);
  (this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.super_SingleFieldGenerator.
  super_FieldGenerator._vptr_FieldGenerator = (_func_int **)&PTR__MapFieldGenerator_006f9958;
  internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::scoped_ptr
            (&this->value_field_generator_,(FieldGenerator *)0x0);
  pDVar2 = FieldDescriptor::message_type((FieldDescriptor *)options_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"key",(allocator<char> *)((long)&value_descriptor + 7));
  pFVar3 = Descriptor::FindFieldByName(pDVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&value_descriptor + 7));
  local_38 = pFVar3;
  pDVar2 = FieldDescriptor::message_type((FieldDescriptor *)options_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"value",&local_89);
  pFVar3 = Descriptor::FindFieldByName(pDVar2,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  local_68 = pFVar3;
  pFVar4 = FieldGenerator::Make(pFVar3,local_20);
  internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::reset
            (&this->value_field_generator_,pFVar4);
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (&this->value_field_generator_);
  FieldGenerator::variable_abi_cxx11_(&local_b0,pFVar4,"field_type");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"field_type",&local_d1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                         super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_d0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_b0);
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (&this->value_field_generator_);
  FieldGenerator::variable_abi_cxx11_(&local_f8,pFVar4,"default");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"default",&local_119);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                         super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_118);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)&local_f8);
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (&this->value_field_generator_);
  FieldGenerator::variable_abi_cxx11_(&local_140,pFVar4,"default_name");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"default_name",
             (allocator<char> *)
             ((long)&field_flags.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                         super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_160);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&field_flags.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_180);
  GetCapitalizedType_abi_cxx11_(&local_1c0,(objectivec *)local_38,field);
  std::operator+(&local_1a0,"GPBFieldMapKey",&local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_180,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"fieldflags",&local_1e1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                         super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_1e0);
  lVar6 = std::__cxx11::string::find((char *)pmVar5,0x5f916f);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  if (lVar6 != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"GPBFieldTextFormatNameCustom",
               (allocator<char> *)((long)&value_field_flags + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_180,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_field_flags + 7));
  }
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (&this->value_field_generator_);
  FieldGenerator::variable_abi_cxx11_(&local_238,pFVar4,"fieldflags");
  local_218 = &local_238;
  lVar6 = std::__cxx11::string::find((char *)local_218,0x61f726);
  if (lVar6 != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"GPBFieldHasDefaultValue",&local_259);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_180,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
  }
  lVar6 = std::__cxx11::string::find((char *)local_218,0x61f73e);
  if (lVar6 != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"GPBFieldHasEnumDescriptor",&local_281);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_180,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
  }
  BuildFlagsString(&local_2a8,FLAGTYPE_FIELD,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value_objc_type,"fieldflags",(allocator<char> *)&value_is_object_type);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                         super_SingleFieldGenerator.super_FieldGenerator.variables_,
                        (key_type *)&value_objc_type);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_2a8);
  std::__cxx11::string::~string((string *)&value_objc_type);
  std::allocator<char>::~allocator((allocator<char> *)&value_is_object_type);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_2d0 = GetObjectiveCType(local_68);
  local_641 = true;
  if ((local_2d0 != OBJECTIVECTYPE_STRING) && (local_641 = true, local_2d0 != OBJECTIVECTYPE_DATA))
  {
    local_641 = local_2d0 == OBJECTIVECTYPE_MESSAGE;
  }
  local_2d1 = local_641;
  OVar1 = GetObjectiveCType(local_38);
  if ((OVar1 == OBJECTIVECTYPE_STRING) && ((local_2d1 & 1U) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"array_storage_type",&local_2f9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                           super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_2f8);
    std::__cxx11::string::operator=((string *)pmVar5,"NSMutableDictionary");
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::
             operator->(&this->value_field_generator_);
    FieldGenerator::variable_abi_cxx11_(&local_360,pFVar4,"storage_type");
    std::operator+(&local_340,"NSMutableDictionary<NSString*, ",&local_360);
    std::operator+(&local_320,&local_340,"*>");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"array_property_type",
               (allocator<char> *)(class_name.field_2._M_local_buf + 0xf));
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                           super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_380);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator((allocator<char> *)(class_name.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3a8,"GPB",&local_3a9);
    std::allocator<char>::~allocator(&local_3a9);
    pcVar7 = anon_unknown_7::MapEntryTypeName(local_38,true);
    std::__cxx11::string::operator+=((string *)local_3a8,pcVar7);
    pcVar7 = anon_unknown_7::MapEntryTypeName(local_68,false);
    std::__cxx11::string::operator+=((string *)local_3a8,pcVar7);
    std::__cxx11::string::operator+=((string *)local_3a8,"Dictionary");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"array_storage_type",&local_3d1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                           super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_3d0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)local_3a8);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    if ((local_2d1 & 1U) != 0) {
      std::operator+(&local_438,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                     "<");
      pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::
               operator->(&this->value_field_generator_);
      FieldGenerator::variable_abi_cxx11_(&local_458,pFVar4,"storage_type");
      std::operator+(&local_418,&local_438,&local_458);
      std::operator+(&local_3f8,&local_418,"*>");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,"array_property_type",&local_479);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                             super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_478);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator(&local_479);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_438);
    }
    std::__cxx11::string::~string((string *)local_3a8);
  }
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (&this->value_field_generator_);
  FieldGenerator::variable_abi_cxx11_(&local_4a0,pFVar4,"dataTypeSpecific_name");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"dataTypeSpecific_name",&local_4c1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                         super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_4c0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  std::__cxx11::string::~string((string *)&local_4a0);
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (&this->value_field_generator_);
  FieldGenerator::variable_abi_cxx11_(&local_4e8,pFVar4,"dataTypeSpecific_value");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"dataTypeSpecific_value",&local_509);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                         super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_508);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_180);
  return;
}

Assistant:

MapFieldGenerator::MapFieldGenerator(const FieldDescriptor* descriptor,
                                     const Options& options)
    : RepeatedFieldGenerator(descriptor, options) {
  const FieldDescriptor* key_descriptor =
      descriptor->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_descriptor =
      descriptor->message_type()->FindFieldByName("value");
  value_field_generator_.reset(FieldGenerator::Make(value_descriptor, options));

  // Pull over some variables_ from the value.
  variables_["field_type"] = value_field_generator_->variable("field_type");
  variables_["default"] = value_field_generator_->variable("default");
  variables_["default_name"] = value_field_generator_->variable("default_name");

  // Build custom field flags.
  std::vector<string> field_flags;
  field_flags.push_back("GPBFieldMapKey" + GetCapitalizedType(key_descriptor));
  // Pull over the current text format custom name values that was calculated.
  if (variables_["fieldflags"].find("GPBFieldTextFormatNameCustom") !=
      string::npos) {
    field_flags.push_back("GPBFieldTextFormatNameCustom");
  }
  // Pull over some info from the value's flags.
  const string& value_field_flags =
      value_field_generator_->variable("fieldflags");
  if (value_field_flags.find("GPBFieldHasDefaultValue") != string::npos) {
    field_flags.push_back("GPBFieldHasDefaultValue");
  }
  if (value_field_flags.find("GPBFieldHasEnumDescriptor") != string::npos) {
    field_flags.push_back("GPBFieldHasEnumDescriptor");
  }
  variables_["fieldflags"] = BuildFlagsString(FLAGTYPE_FIELD, field_flags);

  ObjectiveCType value_objc_type = GetObjectiveCType(value_descriptor);
  const bool value_is_object_type =
      ((value_objc_type == OBJECTIVECTYPE_STRING) ||
       (value_objc_type == OBJECTIVECTYPE_DATA) ||
       (value_objc_type == OBJECTIVECTYPE_MESSAGE));
  if ((GetObjectiveCType(key_descriptor) == OBJECTIVECTYPE_STRING) &&
      value_is_object_type) {
    variables_["array_storage_type"] = "NSMutableDictionary";
    variables_["array_property_type"] =
        "NSMutableDictionary<NSString*, " +
        value_field_generator_->variable("storage_type") + "*>";
  } else {
    string class_name("GPB");
    class_name += MapEntryTypeName(key_descriptor, true);
    class_name += MapEntryTypeName(value_descriptor, false);
    class_name += "Dictionary";
    variables_["array_storage_type"] = class_name;
    if (value_is_object_type) {
      variables_["array_property_type"] =
          class_name + "<" +
          value_field_generator_->variable("storage_type") + "*>";
    }
  }

  variables_["dataTypeSpecific_name"] =
      value_field_generator_->variable("dataTypeSpecific_name");
  variables_["dataTypeSpecific_value"] =
      value_field_generator_->variable("dataTypeSpecific_value");
}